

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_regcb<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  vector<float,_std::allocator<float>_> *min_costs;
  example *peVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  size_t sVar5;
  action_score *paVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  action_score *paVar10;
  action_score *paVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  peVar1 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pfVar2 = (peVar1->pred).scalars._end;
  pfVar3 = (peVar1->pred).scalars._begin;
  sVar5 = data->counter + 1;
  data->counter = sVar5;
  fVar12 = data->max_cb_cost - data->min_cb_cost;
  fVar14 = data->c0;
  uVar9 = (ulong)((long)pfVar2 - (long)pfVar3) >> 3 & 0xffffffff;
  fVar13 = logf((float)(sVar5 * uVar9));
  min_costs = &data->min_costs;
  get_cost_ranges(min_costs,&data->max_costs,fVar12 * fVar12 * fVar14 * fVar13,data,base,examples,
                  data->regcbopt);
  if (data->regcbopt == false) {
    if (uVar9 == 0) {
      fVar14 = 3.4028235e+38;
    }
    else {
      fVar14 = 3.4028235e+38;
      uVar7 = 0;
      do {
        fVar12 = (data->max_costs).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
        if (fVar14 <= fVar12) {
          fVar12 = fVar14;
        }
        fVar14 = fVar12;
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    paVar6 = (peVar1->pred).a_s._begin;
    if ((action_score *)(peVar1->pred).scalars._end != paVar6) {
      uVar9 = 0;
      do {
        paVar6[uVar9].score =
             (float)(~-(uint)(fVar14 < (min_costs->super__Vector_base<float,_std::allocator<float>_>
                                       )._M_impl.super__Vector_impl_data._M_start
                                       [paVar6[uVar9].action]) & 0x3f800000);
        paVar6 = (peVar1->pred).a_s._begin;
        paVar10 = (action_score *)(peVar1->pred).scalars._end;
        if (paVar6 <= paVar10 && (long)paVar10 - (long)paVar6 != 0) {
          uVar7 = (long)paVar10 - (long)paVar6 >> 3;
          paVar11 = paVar6;
          do {
            uVar7 = uVar7 - (-(uint)(paVar11->score == 0.0) & 1);
            paVar11 = paVar11 + 1;
          } while (paVar11 != paVar10);
          do {
            if (0.0 < paVar6->score) {
              paVar6->score = 1.0 / (float)uVar7;
            }
            paVar6 = paVar6 + 1;
          } while (paVar6 != paVar10);
          paVar6 = (peVar1->pred).a_s._begin;
          paVar10 = (action_score *)(peVar1->pred).scalars._end;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)paVar10 - (long)paVar6 >> 3));
    }
  }
  else {
    if (uVar9 == 0) {
      fVar14 = 3.4028235e+38;
      uVar7 = 0;
    }
    else {
      fVar14 = 3.4028235e+38;
      uVar8 = 0;
      uVar7 = 0;
      do {
        fVar12 = (min_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        uVar4 = uVar8;
        if (fVar14 <= fVar12) {
          fVar12 = fVar14;
          uVar4 = uVar7;
        }
        uVar7 = uVar4;
        fVar14 = fVar12;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    paVar6 = (peVar1->pred).a_s._begin;
    if ((action_score *)(peVar1->pred).scalars._end != paVar6) {
      uVar9 = 0;
      do {
        fVar12 = 1.0;
        if (uVar7 != paVar6[uVar9].action) {
          if (data->first_only == false) {
            fVar13 = (min_costs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start[paVar6[uVar9].action];
            fVar12 = 1.0;
            if ((fVar13 == fVar14) && (!NAN(fVar13) && !NAN(fVar14))) goto LAB_00228ed9;
          }
          fVar12 = 0.0;
        }
LAB_00228ed9:
        paVar6[uVar9].score = fVar12;
        uVar9 = uVar9 + 1;
        paVar6 = (peVar1->pred).a_s._begin;
      } while (uVar9 < (ulong)((long)(peVar1->pred).scalars._end - (long)paVar6 >> 3));
    }
  }
  return;
}

Assistant:

void predict_or_learn_regcb(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  if (is_learn && test_adf_sequence(examples) != nullptr)
  {
    uint32_t shared = static_cast<uint32_t>(CB::ec_is_example_header(*examples[0]));
    for (size_t i = shared; i < examples.size() - 1; ++i)
    {
      CB::label& ld = examples[i]->l.cb;
      if (ld.costs.size() == 1)
        ld.costs[0].probability = 1.f;  // no importance weighting
    }

    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)preds.size();
  ++data.counter;

  const float max_range = data.max_cb_cost - data.min_cb_cost;
  // threshold on empirical loss difference
  const float delta = data.c0 * log((float)(num_actions * data.counter)) * pow(max_range, 2);

  if (!is_learn)
  {
    get_cost_ranges(data.min_costs, data.max_costs, delta, data, base, examples,
        /*min_only=*/data.regcbopt);

    if (data.regcbopt)  // optimistic variant
    {
      float min_cost = FLT_MAX;
      size_t a_opt = 0;  // optimistic action
      for (size_t a = 0; a < num_actions; ++a)
      {
        if (data.min_costs[a] < min_cost)
        {
          min_cost = data.min_costs[a];
          a_opt = a;
        }
      }
      for (size_t i = 0; i < preds.size(); ++i)
      {
        if (preds[i].action == a_opt || (!data.first_only && data.min_costs[preds[i].action] == min_cost))
          preds[i].score = 1;
        else
          preds[i].score = 0;
      }
    }
    else  // elimination variant
    {
      float min_max_cost = FLT_MAX;
      for (size_t a = 0; a < num_actions; ++a)
        if (data.max_costs[a] < min_max_cost)
          min_max_cost = data.max_costs[a];
      for (size_t i = 0; i < preds.size(); ++i)
      {
        if (data.min_costs[preds[i].action] <= min_max_cost)
          preds[i].score = 1;
        else
          preds[i].score = 0;
        // explore uniformly on support
        enforce_minimum_probability(1.0, /*update_zero_elements=*/false, begin_scores(preds), end_scores(preds));
      }
    }
  }
}